

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O0

void __thiscall
iu_CsvParamsFloatTest_x_iutest_x_Param_Test::Body(iu_CsvParamsFloatTest_x_iutest_x_Param_Test *this)

{
  float fVar1;
  bool bVar2;
  AssertionResult *ar;
  char *message;
  ParamType_conflict *pPVar3;
  detail *this_00;
  ulong local_448;
  size_t i;
  string local_438;
  string local_418;
  AssertionHelper local_3f8;
  Fixed local_3c8;
  ContainsMatcher<float> local_240;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  float local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_CsvParamsFloatTest_x_iutest_x_Param_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c = 0.0;
  ar = (AssertionResult *)iutest::WithParamInterface<float>::GetParam();
  iutest::internal::backward::NeHelper<false>::Compare<float>
            ((AssertionResult *)local_38,"0.0f","GetParam()",&local_3c,(float *)ar);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar2) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    ar = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
               ,0x72,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  pPVar3 = iutest::WithParamInterface<float>::GetParam();
  iutest::matchers::Contains<float>((matchers *)&local_240,pPVar3);
  iutest::detail::ContainsMatcher<float>::operator()
            ((AssertionResult *)local_230,&local_240,&CsvParamsFloatTest::check_params);
  iutest::detail::ContainsMatcher<float>::~ContainsMatcher(&local_240);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    memset(&local_3c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
    iutest::PrintToString<float[5]>(&local_438,&CsvParamsFloatTest::check_params);
    this_00 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_418,this_00,"Contains( GetParam() )",local_230,ar);
    iutest::AssertionHelper::AssertionHelper
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
               ,0x74,&local_418,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_3f8,&local_3c8);
    iutest::AssertionHelper::~AssertionHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  if (bVar2) {
    for (local_448 = 0; local_448 < 5; local_448 = local_448 + 1) {
      fVar1 = CsvParamsFloatTest::check_params[local_448];
      pPVar3 = iutest::WithParamInterface<float>::GetParam();
      if ((fVar1 == *pPVar3) && (!NAN(fVar1) && !NAN(*pPVar3))) {
        CsvParamsFloatTest::check_params[local_448] = 0.0;
        return;
      }
    }
  }
  return;
}

Assistant:

IUTEST_P(CsvParamsFloatTest, Param)
{
    IUTEST_EXPECT_NE( 0.0f, GetParam() );
#if IUTEST_HAS_MATCHERS
    IUTEST_ASSERT_THAT( check_params, Contains( GetParam() ) );
#endif
    for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
    {
        if( check_params[i] == GetParam() )
        {
            check_params[i] = 0.0f;
            break;
        }
    }
}